

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IlmThreadPool.cpp
# Opt level: O0

void IlmThread_3_4::anon_unknown_5::handleProcessTask(Task *task)

{
  TaskGroup *pTVar1;
  Task *in_RDI;
  TaskGroup *taskGroup;
  
  if (in_RDI != (Task *)0x0) {
    pTVar1 = Task::group(in_RDI);
    (*in_RDI->_vptr_Task[2])();
    if (in_RDI != (Task *)0x0) {
      (*in_RDI->_vptr_Task[1])();
    }
    if (pTVar1 != (TaskGroup *)0x0) {
      TaskGroup::finishOneTask((TaskGroup *)0x108016);
    }
  }
  return;
}

Assistant:

static inline void
handleProcessTask (Task* task)
{
    if (task)
    {
        TaskGroup* taskGroup = task->group ();

        task->execute ();

        // kill the task prior to notifying the group
        // such that any internal reference-based
        // semantics will be handled prior to
        // the task group destructor letting it out
        // of the scope of those references
        delete task;

        if (taskGroup) taskGroup->finishOneTask ();
    }
}